

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::ReportPropertyOrigin
          (cmGeneratorTarget *this,string *p,string *result,string *report,string *compatibilityType
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *this_00;
  pointer pcVar3;
  Snapshot snapshot;
  char *__s;
  size_t sVar4;
  mapped_type *pmVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  long *plVar7;
  cmake *this_01;
  ulong *puVar8;
  size_type *psVar9;
  bool bVar10;
  string areport;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  cmListFileBacktrace local_118;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  cmCommandContext local_a0;
  string *local_78;
  string *local_70;
  long *local_68 [2];
  long local_58 [2];
  Snapshot local_48;
  
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = this->Target->Makefile;
  paVar1 = &local_118.Context.Name.field_2;
  local_118.Context.Name._M_dataplus._M_p = (pointer)paVar1;
  local_78 = report;
  local_70 = result;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"CMAKE_DEBUG_TARGET_PROPERTIES","");
  __s = cmMakefile::GetDefinition(this_00,(string *)&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.Context.Name._M_dataplus._M_p != paVar1) {
    operator_delete(local_118.Context.Name._M_dataplus._M_p,
                    local_118.Context.Name.field_2._M_allocated_capacity + 1);
  }
  if (__s != (char *)0x0) {
    local_118.Context.Name._M_dataplus._M_p = (pointer)paVar1;
    sVar4 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,__s,__s + sVar4);
    cmSystemTools::ExpandListArgument((string *)&local_118,&local_b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.Context.Name._M_dataplus._M_p != paVar1) {
      operator_delete(local_118.Context.Name._M_dataplus._M_p,
                      local_118.Context.Name.field_2._M_allocated_capacity + 1);
    }
  }
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[](&this->DebugCompatiblePropertiesDone,p);
  if (*pmVar5 == false) {
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (local_b8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_b8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,p);
    bVar10 = _Var6._M_current !=
             local_b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    bVar10 = false;
  }
  if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&this->DebugCompatiblePropertiesDone,p);
    *pmVar5 = true;
  }
  if (bVar10) {
    pcVar3 = (compatibilityType->_M_dataplus)._M_p;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar3,pcVar3 + compatibilityType->_M_string_length);
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68," of property \"","");
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_68,(ulong)(p->_M_dataplus)._M_p);
    paVar2 = &local_a0.Name.field_2;
    puVar8 = (ulong *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_a0.Name.field_2._M_allocated_capacity = *puVar8;
      local_a0.Name.field_2._8_8_ = plVar7[3];
      local_a0.Name._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_a0.Name.field_2._M_allocated_capacity = *puVar8;
      local_a0.Name._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_a0.Name._M_string_length = plVar7[1];
    *plVar7 = (long)puVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_a0);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_118.Context.Name.field_2._M_allocated_capacity = *psVar9;
      local_118.Context.Name.field_2._8_8_ = plVar7[3];
      local_118.Context.Name._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_118.Context.Name.field_2._M_allocated_capacity = *psVar9;
      local_118.Context.Name._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_118.Context.Name._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)&local_d8,(ulong)local_118.Context.Name._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.Context.Name._M_dataplus._M_p != paVar1) {
      operator_delete(local_118.Context.Name._M_dataplus._M_p,
                      local_118.Context.Name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.Name._M_dataplus._M_p != paVar2) {
      operator_delete(local_a0.Name._M_dataplus._M_p,local_a0.Name.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    pcVar3 = (this->Target->Name)._M_dataplus._M_p;
    local_118.Context.Name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar3,pcVar3 + (this->Target->Name)._M_string_length);
    std::__cxx11::string::_M_append
              ((char *)&local_d8,(ulong)local_118.Context.Name._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.Context.Name._M_dataplus._M_p != paVar1) {
      operator_delete(local_118.Context.Name._M_dataplus._M_p,
                      local_118.Context.Name.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_d8);
    std::__cxx11::string::_M_append((char *)&local_d8,(ulong)(local_70->_M_dataplus)._M_p);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118,
                   "\"):\n",local_78);
    std::__cxx11::string::_M_append
              ((char *)&local_d8,(ulong)local_118.Context.Name._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.Context.Name._M_dataplus._M_p != paVar1) {
      operator_delete(local_118.Context.Name._M_dataplus._M_p,
                      local_118.Context.Name.field_2._M_allocated_capacity + 1);
    }
    this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
    cmState::Snapshot::Snapshot(&local_48,(cmState *)0x0);
    local_a0.Name._M_string_length = 0;
    local_a0.Name.field_2._M_allocated_capacity =
         local_a0.Name.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_a0.Line = 0;
    snapshot.Position.Tree = local_48.Position.Tree;
    snapshot.State = local_48.State;
    snapshot.Position.Position = local_48.Position.Position;
    local_a0.Name._M_dataplus._M_p = (pointer)paVar2;
    cmListFileBacktrace::cmListFileBacktrace(&local_118,snapshot,&local_a0);
    cmake::IssueMessage(this_01,LOG,&local_d8,&local_118,false);
    cmListFileBacktrace::~cmListFileBacktrace(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.Name._M_dataplus._M_p != paVar2) {
      operator_delete(local_a0.Name._M_dataplus._M_p,local_a0.Name.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  return;
}

Assistant:

void
cmGeneratorTarget::ReportPropertyOrigin(const std::string &p,
                               const std::string &result,
                               const std::string &report,
                               const std::string &compatibilityType) const
{
  std::vector<std::string> debugProperties;
  const char *debugProp = this->Target->GetMakefile()
      ->GetDefinition("CMAKE_DEBUG_TARGET_PROPERTIES");
  if (debugProp)
    {
    cmSystemTools::ExpandListArgument(debugProp, debugProperties);
    }

  bool debugOrigin = !this->DebugCompatiblePropertiesDone[p]
                    && std::find(debugProperties.begin(),
                                 debugProperties.end(),
                                 p)
                        != debugProperties.end();

  if (this->GlobalGenerator->GetConfigureDoneCMP0026())
    {
    this->DebugCompatiblePropertiesDone[p] = true;
    }
  if (!debugOrigin)
    {
    return;
    }

  std::string areport = compatibilityType;
  areport += std::string(" of property \"") + p + "\" for target \"";
  areport += std::string(this->GetName());
  areport += "\" (result: \"";
  areport += result;
  areport += "\"):\n" + report;

  this->LocalGenerator->GetCMakeInstance()->IssueMessage(cmake::LOG, areport);
}